

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_64x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int8_t *piVar5;
  int16_t *piVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  __m256i buf0 [64];
  __m256i buf1 [64];
  longlong local_1060 [256];
  longlong local_860 [2];
  undefined1 auStack_850 [2080];
  
  piVar5 = av1_fwd_txfm_shift_ls[0x12];
  lVar9 = 0;
  do {
    lVar8 = 0;
    piVar6 = input;
    do {
      uVar2 = *(undefined8 *)(piVar6 + 4);
      uVar3 = *(undefined8 *)(piVar6 + 8);
      uVar4 = *(undefined8 *)(piVar6 + 0xc);
      *(undefined8 *)((long)local_1060 + lVar8) = *(undefined8 *)piVar6;
      *(undefined8 *)((long)local_1060 + lVar8 + 8) = uVar2;
      *(undefined8 *)((long)local_1060 + lVar8 + 0x10) = uVar3;
      *(undefined8 *)((long)local_1060 + lVar8 + 0x18) = uVar4;
      lVar8 = lVar8 + 0x20;
      piVar6 = piVar6 + stride;
    } while (lVar8 != 0x200);
    bVar1 = *piVar5;
    if ((char)bVar1 < '\0') {
      auVar10._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar10._2_2_ = auVar10._0_2_;
      auVar10._4_2_ = auVar10._0_2_;
      auVar10._6_2_ = auVar10._0_2_;
      auVar10._8_2_ = auVar10._0_2_;
      auVar10._10_2_ = auVar10._0_2_;
      auVar10._12_2_ = auVar10._0_2_;
      auVar10._14_2_ = auVar10._0_2_;
      auVar10._16_2_ = auVar10._0_2_;
      auVar10._18_2_ = auVar10._0_2_;
      auVar10._20_2_ = auVar10._0_2_;
      auVar10._22_2_ = auVar10._0_2_;
      auVar10._24_2_ = auVar10._0_2_;
      auVar10._26_2_ = auVar10._0_2_;
      auVar10._28_2_ = auVar10._0_2_;
      auVar10._30_2_ = auVar10._0_2_;
      lVar8 = 0;
      do {
        auVar11 = vpaddsw_avx2(auVar10,*(undefined1 (*) [32])((long)local_1060 + lVar8));
        auVar11 = vpsraw_avx2(auVar11,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar11;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar8 = 0;
      do {
        auVar10 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1060 + lVar8),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar10;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x200);
    }
    fdct16x16_new_avx2((__m256i *)local_1060,(__m256i *)local_1060,'\r');
    bVar1 = piVar5[1];
    uVar7 = (uint)(char)bVar1;
    if ((int)uVar7 < 0) {
      auVar11._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar11._2_2_ = auVar11._0_2_;
      auVar11._4_2_ = auVar11._0_2_;
      auVar11._6_2_ = auVar11._0_2_;
      auVar11._8_2_ = auVar11._0_2_;
      auVar11._10_2_ = auVar11._0_2_;
      auVar11._12_2_ = auVar11._0_2_;
      auVar11._14_2_ = auVar11._0_2_;
      auVar11._16_2_ = auVar11._0_2_;
      auVar11._18_2_ = auVar11._0_2_;
      auVar11._20_2_ = auVar11._0_2_;
      auVar11._22_2_ = auVar11._0_2_;
      auVar11._24_2_ = auVar11._0_2_;
      auVar11._26_2_ = auVar11._0_2_;
      auVar11._28_2_ = auVar11._0_2_;
      auVar11._30_2_ = auVar11._0_2_;
      lVar8 = 0;
      do {
        auVar10 = vpaddsw_avx2(auVar11,*(undefined1 (*) [32])((long)local_1060 + lVar8));
        auVar10 = vpsraw_avx2(auVar10,ZEXT416(-uVar7));
        *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar10;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar8 = 0;
      do {
        auVar10 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1060 + lVar8),ZEXT416(uVar7));
        *(undefined1 (*) [32])((long)local_1060 + lVar8) = auVar10;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x200);
    }
    transpose_16bit_16x16_avx2((__m256i *)local_1060,(__m256i *)(local_860 + lVar9 * 0x40));
    lVar9 = lVar9 + 1;
    input = input + 0x10;
  } while (lVar9 != 4);
  fdct16x64_new_avx2((__m256i *)local_860,(__m256i *)local_860,'\f');
  bVar1 = piVar5[2];
  if ((char)bVar1 < '\0') {
    auVar12._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar12._2_2_ = auVar12._0_2_;
    auVar12._4_2_ = auVar12._0_2_;
    auVar12._6_2_ = auVar12._0_2_;
    auVar12._8_2_ = auVar12._0_2_;
    auVar12._10_2_ = auVar12._0_2_;
    auVar12._12_2_ = auVar12._0_2_;
    auVar12._14_2_ = auVar12._0_2_;
    auVar12._16_2_ = auVar12._0_2_;
    auVar12._18_2_ = auVar12._0_2_;
    auVar12._20_2_ = auVar12._0_2_;
    auVar12._22_2_ = auVar12._0_2_;
    auVar12._24_2_ = auVar12._0_2_;
    auVar12._26_2_ = auVar12._0_2_;
    auVar12._28_2_ = auVar12._0_2_;
    auVar12._30_2_ = auVar12._0_2_;
    lVar9 = 0;
    do {
      auVar10 = vpaddsw_avx2(auVar12,*(undefined1 (*) [32])((long)local_860 + lVar9));
      auVar10 = vpsraw_avx2(auVar10,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_860 + lVar9) = auVar10;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x800);
  }
  else if (bVar1 != 0) {
    lVar9 = 0;
    do {
      auVar10 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_860 + lVar9),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_860 + lVar9) = auVar10;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x800);
  }
  lVar9 = 0;
  do {
    auVar10 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)local_860 + lVar9));
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])(auStack_850 + lVar9));
    *(undefined1 (*) [32])((long)output + lVar9 * 2) = auVar10;
    *(undefined1 (*) [32])((long)output + lVar9 * 2 + 0x20) = auVar11;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x400);
  memset(output + 0x200,0,0x800);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X16;
  __m256i buf0[64], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x16_new_avx2;
  const transform_1d_avx2 row_txfm = fdct16x64_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < height_div16; ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < height_div16; i++) {
    __m256i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + 16 * i, 16, 32);
  }
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
}